

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_eng.c
# Opt level: O2

int gost_pkey_meths(ENGINE *e,EVP_PKEY_METHOD **pmeth,int **nids,int nid)

{
  int iVar1;
  EVP_PKEY_METHOD ***pppEVar2;
  
  if (pmeth == (EVP_PKEY_METHOD **)0x0) {
    gost_meth_nids(nids);
    iVar1 = 10;
  }
  else {
    for (pppEVar2 = &gost_meth_array[0].pmeth; ((gost_meth_minfo *)(pppEVar2 + -1))->nid != 0;
        pppEVar2 = pppEVar2 + 5) {
      if (((gost_meth_minfo *)(pppEVar2 + -1))->nid == nid) {
        *pmeth = **pppEVar2;
        return 1;
      }
    }
    *pmeth = (EVP_PKEY_METHOD *)0x0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int gost_pkey_meths(ENGINE *e, EVP_PKEY_METHOD **pmeth,
                           const int **nids, int nid)
{
    struct gost_meth_minfo *info;

    if (!pmeth)
        return gost_meth_nids(nids);

    for (info = gost_meth_array; info->nid; info++)
        if (nid == info->nid) {
            *pmeth = *info->pmeth;
            return 1;
        }
    *pmeth = NULL;
    return 0;
}